

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

void __thiscall
wallet::CWallet::CommitTransaction
          (CWallet *this,CTransactionRef tx,mapValue_t mapValue,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          orderForm)

{
  pointer pCVar1;
  undefined1 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  bool bVar3;
  CWalletTx *wtx;
  iterator iVar4;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_t sVar7;
  element_type *peVar8;
  uchar *puVar9;
  long in_FS_OFFSET;
  basic_string_view<char,_std::char_traits<char>_> parameters_00;
  CTransactionRef tx_00;
  string err_string;
  undefined1 in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff29;
  pointer pCVar10;
  pointer this_01;
  unique_lock<std::recursive_mutex> local_b8;
  pointer local_a8 [2];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  string local_68;
  undefined1 local_40;
  long local_38;
  
  peVar8 = tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8._M_device = &(this->cs_wallet).super_recursive_mutex;
  local_b8._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_b8);
  CTransaction::ToString_abi_cxx11_
            (&local_68,
             (CTransaction *)
             (peVar8->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (local_68._M_string_length == 0) {
    sVar7 = 0;
  }
  else {
    sVar7 = local_68._M_string_length -
            (((char *)((long)local_68._M_dataplus._M_p + -1))[local_68._M_string_length] == '\n');
  }
  parameters_00._M_str = local_68._M_dataplus._M_p;
  parameters_00._M_len = sVar7;
  WalletLogPrintf<std::basic_string_view<char,std::char_traits<char>>>
            (this,"CommitTransaction:\n%s\n",parameters_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  pCVar10 = (peVar8->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start;
  this_01 = (peVar8->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (this_01 != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      puVar9 = (this_01->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8;
      *(int *)puVar9 = *(int *)puVar9 + 1;
      UNLOCK();
    }
    else {
      puVar9 = (this_01->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8;
      *(int *)puVar9 = *(int *)puVar9 + 1;
    }
  }
  local_68._M_dataplus._M_p = local_68._M_dataplus._M_p & 0xffffffffffffff00;
  local_40 = 3;
  local_78._8_8_ =
       std::
       _Function_handler<bool_(wallet::CWalletTx_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:2323:57)>
       ::_M_invoke;
  local_78._0_8_ =
       std::
       _Function_handler<bool_(wallet::CWalletTx_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:2323:57)>
       ::_M_manager;
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_68;
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&stack0xffffffffffffff38;
  local_88._0_8_ =
       tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._M_pi
  ;
  wtx = AddToWallet(this,tx_00,(TxState *)local_88,(UpdateWalletTxFn *)0x1,false,
                    (bool)in_stack_ffffffffffffff28);
  if ((code *)local_78._0_8_ != (code *)0x0) {
    (*(code *)local_78._0_8_)(local_88,local_88,3);
  }
  if (this_01 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  if (wtx == (CWalletTx *)0x0) {
LAB_00532e8c:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_88._0_8_ = local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"CommitTransaction","");
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_88,": Wallet db error, transaction commit failed");
    local_68._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    paVar6 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == paVar6) {
      local_68.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_68.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    }
    else {
      local_68.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    local_68._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    std::runtime_error::runtime_error(this_00,(string *)&local_68);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    pCVar1 = (peVar8->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar9 = *(uchar **)&(pCVar1->prevout).hash;
    puVar2 = *(undefined1 **)((long)&(pCVar1->prevout).hash + 8);
    if (puVar9 != puVar2) {
      do {
        iVar4 = _GLOBAL__N_1::std::
                _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)&this->mapWallet,(key_type *)puVar9);
        if (iVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
            _M_cur == (__node_type *)0x0) {
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_005330c4;
          std::__throw_out_of_range("_Map_base::at");
          goto LAB_00532e8c;
        }
        *(undefined8 *)
         ((long)iVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                _M_cur + 0x90) = 0;
        *(undefined8 *)
         ((long)iVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                _M_cur + 0xd8) = 0;
        *(undefined8 *)
         ((long)iVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                _M_cur + 0x120) = 0;
        *(undefined8 *)
         ((long)iVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                _M_cur + 0x168) = 0;
        *(undefined2 *)
         ((long)iVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                _M_cur + 0x1b0) = 1;
        boost::signals2::
        signal<void_(const_uint256_&,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_uint256_&,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_uint256_&,_ChangeType)>,_boost::signals2::mutex>
        ::operator()(&this->NotifyTransactionChanged,
                     (uint256 *)
                     (*(long *)((long)iVar4.
                                      super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                      ._M_cur + 0x1c0) + 0x39),CT_UPDATED);
        puVar9 = puVar9 + 0x68;
      } while (puVar9 != puVar2);
    }
    if (this->fBroadcastTransactions != false) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      local_68._M_string_length = 0;
      local_68.field_2._M_allocated_capacity =
           local_68.field_2._M_allocated_capacity & 0xffffffffffffff00;
      bVar3 = SubmitTxMemoryPoolAndRelay(this,wtx,&local_68,true);
      if (!bVar3) {
        local_a8[0] = (pointer)local_98;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a8,local_68._M_dataplus._M_p,
                   local_68._M_string_length + local_68._M_dataplus._M_p);
        parameters._M_dataplus._M_p._1_7_ = in_stack_ffffffffffffff29;
        parameters._M_dataplus._M_p._0_1_ = in_stack_ffffffffffffff28;
        parameters._M_string_length = (size_type)wtx;
        parameters.field_2._M_allocated_capacity = (size_type)pCVar10;
        parameters.field_2._8_8_ = this_01;
        WalletLogPrintf<std::__cxx11::string>
                  (this,"CommitTransaction(): Transaction cannot be broadcast immediately, %s\n",
                   parameters);
        if (local_a8[0] != (pointer)local_98) {
          operator_delete(local_a8[0],local_98._0_8_ + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_b8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
LAB_005330c4:
  __stack_chk_fail();
}

Assistant:

void CWallet::CommitTransaction(CTransactionRef tx, mapValue_t mapValue, std::vector<std::pair<std::string, std::string>> orderForm)
{
    LOCK(cs_wallet);
    WalletLogPrintf("CommitTransaction:\n%s\n", util::RemoveSuffixView(tx->ToString(), "\n"));

    // Add tx to wallet, because if it has change it's also ours,
    // otherwise just for transaction history.
    CWalletTx* wtx = AddToWallet(tx, TxStateInactive{}, [&](CWalletTx& wtx, bool new_tx) {
        CHECK_NONFATAL(wtx.mapValue.empty());
        CHECK_NONFATAL(wtx.vOrderForm.empty());
        wtx.mapValue = std::move(mapValue);
        wtx.vOrderForm = std::move(orderForm);
        wtx.fTimeReceivedIsTxTime = true;
        wtx.fFromMe = true;
        return true;
    });

    // wtx can only be null if the db write failed.
    if (!wtx) {
        throw std::runtime_error(std::string(__func__) + ": Wallet db error, transaction commit failed");
    }

    // Notify that old coins are spent
    for (const CTxIn& txin : tx->vin) {
        CWalletTx &coin = mapWallet.at(txin.prevout.hash);
        coin.MarkDirty();
        NotifyTransactionChanged(coin.GetHash(), CT_UPDATED);
    }

    if (!fBroadcastTransactions) {
        // Don't submit tx to the mempool
        return;
    }

    std::string err_string;
    if (!SubmitTxMemoryPoolAndRelay(*wtx, err_string, true)) {
        WalletLogPrintf("CommitTransaction(): Transaction cannot be broadcast immediately, %s\n", err_string);
        // TODO: if we expect the failure to be long term or permanent, instead delete wtx from the wallet and return failure.
    }
}